

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::detail::SocketStream::is_writable(SocketStream *this)

{
  bool bVar1;
  ssize_t sVar2;
  
  sVar2 = select_write(this->sock_,this->write_timeout_sec_,this->write_timeout_usec_);
  if (0 < sVar2) {
    bVar1 = is_socket_alive(this->sock_);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool SocketStream::is_writable() const {
  return select_write(sock_, write_timeout_sec_, write_timeout_usec_) > 0 &&
         is_socket_alive(sock_);
}